

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

ssize_t __thiscall
TasGrid::TasmanianSparseGrid::write(TasmanianSparseGrid *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  byte bVar2;
  runtime_error *this_00;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  char local_220 [8];
  ofstream ofs;
  bool binary_local;
  char *filename_local;
  TasmanianSparseGrid *this_local;
  
  bVar1 = (byte)__buf & 1;
  ::std::ofstream::ofstream(local_220);
  if (bVar1 == 1) {
    ::std::operator|(_S_out,_S_bin);
    ::std::ofstream::open(local_220,__fd);
  }
  else {
    ::std::ofstream::open(local_220,__fd);
  }
  bVar2 = ::std::ios::good();
  if ((bVar2 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"ERROR: occurred when trying to write to file: ",&local_271);
    ::std::operator+(&local_250,&local_270,(char *)CONCAT44(in_register_00000034,__fd));
    ::std::runtime_error::runtime_error(this_00,(string *)&local_250);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  write(this,(int)local_220,(void *)(ulong)bVar1,__n);
  ::std::ofstream::close();
  sVar3 = ::std::ofstream::~ofstream(local_220);
  return sVar3;
}

Assistant:

void TasmanianSparseGrid::write(const char *filename, bool binary) const{
    std::ofstream ofs;
    if (binary == mode_binary){
        ofs.open(filename, std::ios::out | std::ios::binary);
    }else{
        ofs.open(filename);
    }
    if (!ofs.good()) throw std::runtime_error(std::string("ERROR: occurred when trying to write to file: ") + filename);
    write(ofs, binary);
    ofs.close();
}